

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,EVP_PKEY_CTX *ctx)

{
  path *this_00;
  long lVar1;
  
  this_00 = this->data_;
  if (this->len != 0) {
    lVar1 = this->len * 0x28;
    do {
      std::filesystem::__cxx11::path::~path(this_00);
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -0x28;
    } while (lVar1 != 0);
    this_00 = this->data_;
  }
  if (this_00 != (path *)this->firstElement) {
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }